

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

SUNErrCode
N_VScaleAddMultiVectorArray_Serial
          (int nvec,int nsum,sunrealtype *a,N_Vector *X,N_Vector **Y,N_Vector **Z)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  void *__ptr;
  void *__ptr_00;
  long *in_RCX;
  long in_RDX;
  int in_ESI;
  int in_EDI;
  N_Vector in_R8;
  N_Vector in_R9;
  N_Vector *ZZ;
  N_Vector *YY;
  sunrealtype *zd;
  sunrealtype *yd;
  sunrealtype *xd;
  sunindextype N;
  sunindextype k;
  int j;
  int i;
  SUNContext_conflict sunctx_local_scope_;
  long local_48;
  int iVar5;
  int iVar6;
  undefined4 in_stack_ffffffffffffffc4;
  N_Vector *Y_00;
  
  Y_00 = *(N_Vector **)(*in_RCX + 0x10);
  if (in_EDI == 1) {
    if (in_ESI == 1) {
      N_VLinearSum_Serial((sunrealtype)k,(N_Vector)N,(sunrealtype)xd,(N_Vector)yd,(N_Vector)zd);
    }
    else {
      __ptr = malloc((long)in_ESI << 3);
      iVar6 = (int)in_RCX;
      __ptr_00 = malloc((long)in_ESI << 3);
      for (iVar5 = 0; iVar5 < in_ESI; iVar5 = iVar5 + 1) {
        *(undefined8 *)((long)__ptr + (long)iVar5 * 8) = *(&in_R8->content)[iVar5];
        *(undefined8 *)((long)__ptr_00 + (long)iVar5 * 8) = *(&in_R9->content)[iVar5];
      }
      N_VScaleAddMulti_Serial
                (iVar6,(sunrealtype *)in_R8,in_R9,Y_00,
                 (N_Vector *)CONCAT44(in_stack_ffffffffffffffc4,iVar5));
      free(__ptr);
      free(__ptr_00);
    }
  }
  else if (in_ESI == 1) {
    N_VLinearSumVectorArray_Serial
              ((int)sunctx_local_scope_,_j,(N_Vector *)k,(sunrealtype)N,(N_Vector *)xd,
               (N_Vector *)yd);
  }
  else {
    lVar1 = **(long **)*in_RCX;
    if (in_R8 == in_R9) {
      for (iVar5 = 0; iVar5 < in_EDI; iVar5 = iVar5 + 1) {
        lVar2 = *(long *)(*(long *)in_RCX[iVar5] + 0x10);
        for (iVar6 = 0; iVar6 < in_ESI; iVar6 = iVar6 + 1) {
          lVar3 = *(long *)(**(long **)((long)(&in_R8->content)[iVar6] + (long)iVar5 * 8) + 0x10);
          for (local_48 = 0; local_48 < lVar1; local_48 = local_48 + 1) {
            *(double *)(lVar3 + local_48 * 8) =
                 *(double *)(in_RDX + (long)iVar6 * 8) * *(double *)(lVar2 + local_48 * 8) +
                 *(double *)(lVar3 + local_48 * 8);
          }
        }
      }
    }
    else {
      for (iVar5 = 0; iVar5 < in_EDI; iVar5 = iVar5 + 1) {
        lVar2 = *(long *)(*(long *)in_RCX[iVar5] + 0x10);
        for (iVar6 = 0; iVar6 < in_ESI; iVar6 = iVar6 + 1) {
          lVar3 = *(long *)(**(long **)((long)(&in_R8->content)[iVar6] + (long)iVar5 * 8) + 0x10);
          lVar4 = *(long *)(**(long **)((long)(&in_R9->content)[iVar6] + (long)iVar5 * 8) + 0x10);
          for (local_48 = 0; local_48 < lVar1; local_48 = local_48 + 1) {
            *(double *)(lVar4 + local_48 * 8) =
                 *(double *)(in_RDX + (long)iVar6 * 8) * *(double *)(lVar2 + local_48 * 8) +
                 *(double *)(lVar3 + local_48 * 8);
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

SUNErrCode N_VScaleAddMultiVectorArray_Serial(int nvec, int nsum,
                                              sunrealtype* a, N_Vector* X,
                                              N_Vector** Y, N_Vector** Z)
{
  SUNFunctionBegin(X[0]->sunctx);
  int i, j;
  sunindextype k, N;
  sunrealtype* xd = NULL;
  sunrealtype* yd = NULL;
  sunrealtype* zd = NULL;
  N_Vector* YY;
  N_Vector* ZZ;

  /* invalid number of vectors */
  SUNAssert(nvec >= 1 && nsum >= 1, SUN_ERR_ARG_OUTOFRANGE);

  /* ---------------------------
   * Special cases for nvec == 1
   * --------------------------- */

  if (nvec == 1)
  {
    /* should have called N_VLinearSum */
    if (nsum == 1)
    {
      N_VLinearSum_Serial(a[0], X[0], ONE, Y[0][0], Z[0][0]);
      SUNCheckLastErr();
      return SUN_SUCCESS;
    }

    /* should have called N_VScaleAddMulti */
    YY = (N_Vector*)malloc(nsum * sizeof(N_Vector));
    SUNAssert(YY, SUN_ERR_MALLOC_FAIL);
    ZZ = (N_Vector*)malloc(nsum * sizeof(N_Vector));
    SUNAssert(ZZ, SUN_ERR_MALLOC_FAIL);

    for (j = 0; j < nsum; j++)
    {
      YY[j] = Y[j][0];
      ZZ[j] = Z[j][0];
    }

    SUNCheckCall(N_VScaleAddMulti_Serial(nsum, a, X[0], YY, ZZ));

    free(YY);
    free(ZZ);

    return SUN_SUCCESS;
  }

  /* --------------------------
   * Special cases for nvec > 1
   * -------------------------- */

  /* should have called N_VLinearSumVectorArray */
  if (nsum == 1)
  {
    SUNCheckCall(N_VLinearSumVectorArray_Serial(nvec, a[0], X, ONE, Y[0], Z[0]));
    return SUN_SUCCESS;
  }

  /* ----------------------------
   * Compute multiple linear sums
   * ---------------------------- */

  /* get vector length */
  N = NV_LENGTH_S(X[0]);

  /*
   * Y[i][j] += a[i] * x[j]
   */
  if (Y == Z)
  {
    for (i = 0; i < nvec; i++)
    {
      xd = NV_DATA_S(X[i]);
      for (j = 0; j < nsum; j++)
      {
        yd = NV_DATA_S(Y[j][i]);
        for (k = 0; k < N; k++) { yd[k] += a[j] * xd[k]; }
      }
    }
    return SUN_SUCCESS;
  }

  /*
   * Z[i][j] = Y[i][j] + a[i] * x[j]
   */
  for (i = 0; i < nvec; i++)
  {
    xd = NV_DATA_S(X[i]);
    for (j = 0; j < nsum; j++)
    {
      yd = NV_DATA_S(Y[j][i]);
      zd = NV_DATA_S(Z[j][i]);
      for (k = 0; k < N; k++) { zd[k] = a[j] * xd[k] + yd[k]; }
    }
  }
  return SUN_SUCCESS;
}